

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O0

void __thiscall
RK_Individual::geraPesosConfInicial(RK_Individual *this,int *idsAbertos,int n,Graph *g)

{
  bool bVar1;
  int iVar2;
  int local_44;
  Edge *pEStack_40;
  int i;
  Edge *a;
  Vertex *no;
  int j;
  Graph *g_local;
  int n_local;
  int *idsAbertos_local;
  RK_Individual *this_local;
  
  resetaPesos(this,1.0);
  no._4_4_ = 0;
  for (a = (Edge *)Graph::get_verticesList(g); a != (Edge *)0x0;
      a = (Edge *)Vertex::getNext((Vertex *)a)) {
    for (pEStack_40 = Vertex::getEdgesList((Vertex *)a); pEStack_40 != (Edge *)0x0;
        pEStack_40 = Edge::getNext(pEStack_40)) {
      bVar1 = Edge::getModifiable(pEStack_40);
      if (bVar1) {
        bVar1 = Edge::getMarked(pEStack_40);
        if (bVar1) {
          for (local_44 = 0; local_44 < n; local_44 = local_44 + 1) {
            iVar2 = Edge::getID(pEStack_40);
            if (iVar2 == idsAbertos[local_44]) {
              this->weights[no._4_4_] = 0.0;
            }
          }
          no._4_4_ = no._4_4_ + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void RK_Individual::geraPesosConfInicial(int *idsAbertos, int n, Graph *g){

//    cout << "vai gerar conf inicial:\n--------------------------------" << endl;

//    cout << "idsAberto = {" << endl;
//    for(int i=0; i<n; i++)
//        cout << idsAbertos[i] << endl;
//    cout << "}" << endl;

    this->resetaPesos(1.0);
    int j=0;
    for(Vertex *no = g->get_verticesList(); no != NULL; no= no->getNext()){

        for(Edge *a = no->getEdgesList(); a != NULL; a= a->getNext()){

            if(a->getModifiable() == true && a->getMarked() == true){
                for(int i=0; i<n; i++){
                    if(a->getID()==idsAbertos[i]){
                        this->weights[j] = 0.0;
//                            cout << "A{" <<a->getID() << "}" << endl;
                    }
                }
                j++;
            }

        }
    }
//    cout << "--------------------------------" << endl;
}